

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteBook.cpp
# Opt level: O2

void __thiscall DeleteBook::operator()(DeleteBook *this)

{
  HttpRequest *this_00;
  bool bVar1;
  unsigned_short uVar2;
  string *psVar3;
  ostream *poVar4;
  Session *session;
  char *pcVar5;
  string reply;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  bVar1 = Session::IsConnected((this->super_Event).m_Owner);
  if (bVar1) {
    psVar3 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
    if (psVar3->_M_string_length != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      local_30._M_string_length = 0;
      local_30.field_2._M_local_buf[0] = '\0';
      std::operator<<((ostream *)&std::cout,"Id:");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_30);
      std::operator+(&local_50,"/api/v1/tema/library/books/",&local_30);
      this_00 = &(this->super_Event).m_Request;
      HttpRequest::SetRequest(this_00,"DELETE",local_50._M_dataplus._M_p,"HTTP/1.1","");
      std::__cxx11::string::~string((string *)&local_50);
      HttpRequest::SetHost(this_00,"ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
      HttpRequest::ClearHeaders(this_00);
      HttpRequest::AddHeader(this_00,"Connection","keep-alive");
      psVar3 = Session::GetToken_abi_cxx11_((this->super_Event).m_Owner);
      std::operator+(&local_50,"Bearer ",psVar3);
      HttpRequest::AddHeader(this_00,"Authorization",local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      HttpRequest::ClearCookies(this_00);
      psVar3 = Session::GetConnectSid_abi_cxx11_((this->super_Event).m_Owner);
      HttpRequest::AddCookie(this_00,"connect.sid",(psVar3->_M_dataplus)._M_p);
      HttpRequest::SetData(this_00,"");
      Session::OpenConnection((this->super_Event).m_Owner);
      HttpRequest::Send(this_00,(this->super_Event).m_Owner);
      Connection::ReceiveHttps_abi_cxx11_
                (&local_50,(Connection *)(this->super_Event).m_Owner,session);
      Session::CloseConnection((this->super_Event).m_Owner);
      uVar2 = HttpReply::ExtractSign(&local_50);
      if (uVar2 == 200) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Delete book successes");
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Delete book failed ");
        poVar4 = std::operator<<(poVar4,"error ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,uVar2);
      }
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      return;
    }
    pcVar5 = "To proceed this command you need library access";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"You are not connected");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar5 = "Please login to proceed this command";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void DeleteBook::operator()() {
    using namespace std;
    if (!m_Owner->IsConnected()) {
        cout << "You are not connected" << endl;
        cout << "Please login to proceed this command" << endl;
        return;
    }
    else if (m_Owner->GetToken().empty()) {
        cout << "To proceed this command you need library access" << endl;
        return;
    }
    string id;
    cout << "Id:"   ,   getline(cin, id);
    m_Request.SetRequest("DELETE", ("/api/v1/tema/library/books/" + id).c_str(), "HTTP/1.1");
    m_Request.SetHost("ec2-3-8-116-10.eu-west-2.compute.amazonaws.com:8080");
    m_Request.ClearHeaders();
    m_Request.AddHeader("Connection", "keep-alive");
    m_Request.AddHeader("Authorization", ("Bearer " + m_Owner->GetToken()).c_str());
    m_Request.ClearCookies();
    m_Request.AddCookie("connect.sid", m_Owner->GetConnectSid().c_str());
    m_Request.SetData("");
    m_Owner->OpenConnection();
    m_Request.Send(*m_Owner);
    std::string reply = Connection::ReceiveHttps(*m_Owner);
    m_Owner->CloseConnection();
    unsigned short sign = HttpReply::ExtractSign(reply);
    if (sign == 200) {
        cout << "Delete book successes" << std::endl;
    }
    else {
        cout << "Delete book failed " << "error " << sign << std::endl;
    }
}